

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_alpn_contains_proto(alpn_spec *spec,char *proto)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  
  if (proto == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(proto);
  }
  bVar4 = spec != (alpn_spec *)0x0;
  if (__n != 0 && bVar4) {
    lVar3 = spec->count + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return false;
      }
      sVar2 = strlen((char *)spec);
      if ((sVar2 == __n) && (iVar1 = bcmp(proto,spec,__n), iVar1 == 0)) {
        return true;
      }
      spec = (alpn_spec *)(spec->entries + 1);
    } while (__n != 0 && bVar4);
  }
  return false;
}

Assistant:

bool Curl_alpn_contains_proto(const struct alpn_spec *spec,
                              const char *proto)
{
  size_t i, plen = proto ? strlen(proto) : 0;
  for(i = 0; spec && plen && i < spec->count; ++i) {
    size_t slen = strlen(spec->entries[i]);
    if((slen == plen) && !memcmp(proto, spec->entries[i], plen))
      return TRUE;
  }
  return FALSE;
}